

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Prog * duckdb_re2::Compiler::CompileSet(Regexp *re,Anchor anchor,int64_t max_mem)

{
  Regexp *re_00;
  Prog *this;
  ulong uVar2;
  Frag FVar3;
  Frag FVar4;
  Frag a;
  bool dfa_failed;
  undefined4 local_130;
  undefined8 uStack_12c;
  uint uStack_124;
  StringPiece sp;
  Compiler local_110;
  undefined8 uVar1;
  
  Compiler(&local_110);
  if ((re->parse_flags_ & 0x20) != 0) {
    local_110.encoding_ = kEncodingLatin1;
  }
  if (max_mem < 1) {
    local_110.max_ninst_ = 100000;
  }
  else {
    local_110.max_ninst_ = 0;
    if (0x1b0 < (ulong)max_mem) {
      local_110.max_ninst_ = 0x1000000;
      if (max_mem - 0x1b0U < 0x8000000) {
        local_110.max_ninst_ = (int)(max_mem - 0x1b0U >> 3);
      }
    }
  }
  local_110.max_mem_ = max_mem;
  local_110.anchor_ = anchor;
  re_00 = Regexp::Simplify(re);
  if (re_00 != (Regexp *)0x0) {
    local_130 = 0;
    uStack_12c = 0;
    uStack_124 = uStack_124 & 0xffffff00;
    local_110.super_Walker<duckdb_re2::Frag>.max_visits_ = local_110.max_ninst_ * 2;
    FVar3._12_4_ = uStack_124;
    FVar3.begin = 0;
    FVar3.end.head = 0;
    FVar3.end.tail = 0;
    FVar3 = Regexp::Walker<duckdb_re2::Frag>::WalkInternal
                      (&local_110.super_Walker<duckdb_re2::Frag>,re_00,FVar3,false);
    uVar1 = FVar3._0_8_;
    Regexp::Decref(re_00);
    if (local_110.failed_ == false) {
      (local_110.prog_)->anchor_start_ = true;
      (local_110.prog_)->anchor_end_ = true;
      if (anchor == UNANCHORED) {
        FVar4 = DotStar(&local_110);
        uVar2 = FVar3._8_8_ & 0xffffffffff;
        a._8_8_ = FVar4._8_8_ & 0xffffffffff;
        a.begin = (int)FVar4._0_8_;
        a.end.head = (int)((ulong)FVar4._0_8_ >> 0x20);
        FVar4.end.tail = (int)uVar2;
        FVar4.nullable = (bool)(char)(uVar2 >> 0x20);
        FVar4._13_3_ = (int3)(uVar2 >> 0x28);
        FVar4.begin = (int)uVar1;
        FVar4.end.head = (int)((ulong)uVar1 >> 0x20);
        FVar3 = Cat(&local_110,a,FVar4);
        uVar1 = FVar3._0_8_;
      }
      (local_110.prog_)->start_ = (int)uVar1;
      (local_110.prog_)->start_unanchored_ = (int)uVar1;
      this = Finish(&local_110,re);
      if (this != (Prog *)0x0) {
        dfa_failed = false;
        sp.data_ = "hello, world";
        sp.size_ = 0xc;
        Prog::SearchDFA(this,&sp,&sp,kAnchored,kManyMatch,(StringPiece *)0x0,&dfa_failed,
                        (SparseSet *)0x0);
        if (dfa_failed != true) goto LAB_011e80a7;
        Prog::~Prog(this);
        operator_delete(this);
      }
    }
  }
  this = (Prog *)0x0;
LAB_011e80a7:
  ~Compiler(&local_110);
  return this;
}

Assistant:

Prog* Compiler::CompileSet(Regexp* re, RE2::Anchor anchor, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, anchor);

  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  if (anchor == RE2::UNANCHORED) {
    // Prepend .* or else the expression will effectively be anchored.
    // Complemented by the ANCHOR_BOTH case in PostVisit().
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);

  Prog* prog = c.Finish(re);
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool dfa_failed = false;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &dfa_failed, NULL);
  if (dfa_failed) {
    delete prog;
    return NULL;
  }

  return prog;
}